

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O0

void set_params_for_intnl_overlay_frames
               (GF_GROUP *gf_group,int *cur_frame_idx,int *frame_ind,int *first_frame_index,
               int *cur_disp_index,int layer_depth)

{
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  GF_GROUP *in_RDI;
  int *in_R8;
  int in_R9D;
  
  in_RDI->update_type[*in_RDX] = '\x05';
  in_RDI->arf_src_offset[*in_RDX] = '\0';
  in_RDI->cur_frame_idx[*in_RDX] = (uchar)*in_RSI;
  in_RDI->layer_depth[*in_RDX] = in_R9D;
  in_RDI->frame_type[*in_RDX] = '\x01';
  in_RDI->refbuf_state[*in_RDX] = '\x01';
  in_RDI->display_idx[*in_RDX] = *in_R8;
  *in_R8 = *in_R8 + 1;
  set_src_offset(in_RDI,in_RCX,*in_RSI,*in_RDX);
  *in_RDX = *in_RDX + 1;
  *in_RSI = *in_RSI + 1;
  return;
}

Assistant:

static inline void set_params_for_intnl_overlay_frames(
    GF_GROUP *const gf_group, int *cur_frame_idx, int *frame_ind,
    int *first_frame_index, int *cur_disp_index, int layer_depth) {
  gf_group->update_type[*frame_ind] = INTNL_OVERLAY_UPDATE;
  gf_group->arf_src_offset[*frame_ind] = 0;
  gf_group->cur_frame_idx[*frame_ind] = *cur_frame_idx;
  gf_group->layer_depth[*frame_ind] = layer_depth;
  gf_group->frame_type[*frame_ind] = INTER_FRAME;
  gf_group->refbuf_state[*frame_ind] = REFBUF_UPDATE;
  gf_group->display_idx[*frame_ind] = (*cur_disp_index);
  ++(*cur_disp_index);

  set_src_offset(gf_group, first_frame_index, *cur_frame_idx, *frame_ind);
  ++(*frame_ind);
  ++(*cur_frame_idx);
}